

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O3

void __thiscall helics::SmallBuffer::reserve(SmallBuffer *this,size_t size)

{
  byte *__src;
  byte *__dest;
  undefined8 *puVar1;
  
  if (this->bufferCapacity < size) {
    if ((0x1000000000 < size) || (this->locked == true)) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = std::ostream::operator<<;
      __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    __dest = (byte *)operator_new__(size + 8);
    __src = this->heap;
    memcpy(__dest,__src,this->bufferSize);
    if ((this->usingAllocatedBuffer == true) && (__src != (byte *)0x0 && this->nonOwning == false))
    {
      operator_delete__(__src);
    }
    this->heap = __dest;
    this->nonOwning = false;
    this->usingAllocatedBuffer = true;
    this->bufferCapacity = size + 8;
  }
  return;
}

Assistant:

void reserve(size_t size)
    {
        static constexpr size_t bigSize{sizeof(size_t) == 8 ? 0x010'0000'0000U : 0xFFFF'0000U};
        if (size > bufferCapacity) {
            if (size > bigSize || locked) {
                throw(std::bad_alloc());
            }
            auto* ndata = new std::byte[size + 8];
            std::memcpy(ndata, heap, bufferSize);
            if (usingAllocatedBuffer && !nonOwning) {
                delete[] heap;
            }
            heap = ndata;
            nonOwning = false;
            usingAllocatedBuffer = true;
            bufferCapacity = size + 8;
        }
    }